

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::MatchLiteralNode::Emit(MatchLiteralNode *this,Compiler *compiler,CharCount *skipped)

{
  uint offset;
  CharCount length;
  uint *puVar1;
  char16_t **ppcVar2;
  MatchLiteralEquivInst *this_00;
  MatchLiteralInst *this_01;
  int iVar3;
  Char *cs;
  CharCount effectiveLength;
  CharCount effectiveOffset;
  CharCount *skipped_local;
  Compiler *compiler_local;
  MatchLiteralNode *this_local;
  
  if (*skipped < this->length) {
    iVar3 = 1;
    if ((this->isEquivClass & 1U) != 0) {
      iVar3 = 4;
    }
    offset = this->offset + *skipped * iVar3;
    length = this->length - *skipped;
    puVar1 = min<unsigned_int>(skipped,&this->length);
    *skipped = *skipped - *puVar1;
    if (length == 1) {
      ppcVar2 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(compiler->program->rep).insts.litbuf);
      MatchCharNode::Emit(compiler,*ppcVar2 + offset,(bool)(this->isEquivClass & 1));
    }
    else if ((this->isEquivClass & 1U) == 0) {
      this_01 = (MatchLiteralInst *)Compiler::Emit(compiler,9);
      MatchLiteralInst::MatchLiteralInst(this_01,offset,length);
    }
    else {
      this_00 = (MatchLiteralEquivInst *)Compiler::Emit(compiler,9);
      MatchLiteralEquivInst::MatchLiteralEquivInst(this_00,offset,length);
    }
  }
  else {
    *skipped = *skipped - this->length;
  }
  return;
}

Assistant:

void MatchLiteralNode::Emit(Compiler& compiler, CharCount& skipped)
    {
        if (skipped >= length)
        {
            // Asking to skip entire literal
            skipped -= length;
            return;
        }

        //
        // Compilation scheme:
        //
        //   Match(Char|Char4|Literal|LiteralEquiv)Inst
        //

        CharCount effectiveOffset = offset + skipped * (isEquivClass ? CaseInsensitive::EquivClassSize : 1);
        CharCount effectiveLength = length - skipped;
        skipped -= min(skipped, length);

        if (effectiveLength == 1)
        {
            Char* cs = compiler.program->rep.insts.litbuf + effectiveOffset;
            MatchCharNode::Emit(compiler, cs, isEquivClass);
        }
        else
        {
            if (isEquivClass)
                EMIT(compiler, MatchLiteralEquivInst, effectiveOffset, effectiveLength);
            else
                EMIT(compiler, MatchLiteralInst, effectiveOffset, effectiveLength);
        }
    }